

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

bool __thiscall Assimp::XGLImporter::SkipToText(XGLImporter *this)

{
  int iVar1;
  int iVar2;
  allocator<char> local_49;
  string local_48;
  
LAB_0050c712:
  iVar1 = (*((this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_IIrrXMLReader[2])();
  if (SUB41(iVar1,0) != false) {
    iVar2 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[3])();
    if (iVar2 != 3) {
      iVar1 = (*((this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_IIrrXMLReader[3])();
      if (iVar1 != 1) goto code_r0x0050c740;
      goto LAB_0050c74f;
    }
  }
  return SUB41(iVar1,0);
code_r0x0050c740:
  iVar1 = (*((this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 2) {
LAB_0050c74f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "expected text contents but found another element (or element end)",&local_49);
    LogFunctions<Assimp::XGLImporter>::ThrowException(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  goto LAB_0050c712;
}

Assistant:

bool XGLImporter::SkipToText()
{
    while(m_reader->read()) {
        if (m_reader->getNodeType() == EXN_TEXT) {
            return true;
        }
        else if (m_reader->getNodeType() == EXN_ELEMENT || m_reader->getNodeType() == EXN_ELEMENT_END) {
            ThrowException("expected text contents but found another element (or element end)");
        }
    }
    return false;
}